

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_draw.cpp
# Opt level: O3

void Am_Draw_Check_Button_Box
               (am_rect r,Am_Drawonable *draw,Am_Widget_Look look,bool selected,
               bool interim_selected,Computed_Colors_Record *color_rec,bool mask)

{
  am_rect r_00;
  am_rect r_01;
  int left;
  int top;
  int width;
  int height;
  ulong uVar1;
  Am_Style *prev;
  ulong uVar2;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  am_rect r_local;
  Am_Style upper_left;
  Am_Style lower_right;
  Am_Style fill_style;
  Am_Style line_style;
  Am_Style local_a8;
  Am_Style local_a0;
  Am_Style local_98;
  Am_Style local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  Am_Image_Array local_60;
  Am_Image_Array local_58;
  Am_Image_Array local_50;
  float local_48;
  
  uVar1 = r._8_8_;
  uVar2 = r._0_8_;
  local_78 = (float)CONCAT71(in_register_00000089,interim_selected);
  local_88 = (float)CONCAT71(in_register_00000081,selected);
  r_local.left = r.left;
  left = r_local.left;
  r_local.top = r.top;
  top = r_local.top;
  r_local.width = r.width;
  width = r_local.width;
  r_local.height = r.height;
  height = r_local.height;
  (*draw->_vptr_Am_Drawonable[0x21])(draw,uVar2 & 0xffffffff,uVar2 >> 0x20,uVar1 & 0xffffffff);
  if (look.value == Am_MACINTOSH_LOOK_val) {
    Am_Image_Array::Am_Image_Array(&local_58,&Am_No_Image);
    Am_Style::Am_Style(&upper_left,"black",local_78._0_1_ + 1,Am_CAP_BUTT,Am_JOIN_MITER,
                       Am_LINE_SOLID,"\x04\x04",2,Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,
                       (Am_Image_Array_Data *)&local_58);
    Am_Image_Array::~Am_Image_Array(&local_58);
    Am_Style::Am_Style(&lower_right,&Am_White);
    uVar3 = 7;
    if (!mask) {
      uVar3 = 0;
    }
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&upper_left,&lower_right,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
               (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,uVar3);
    if (local_88._0_1_ != '\0') {
      Am_Image_Array::Am_Image_Array(&local_60,&Am_No_Image);
      Am_Style::Am_Style(&fill_style,"black",1,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
                         Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,(Am_Image_Array_Data *)&local_60);
      Am_Style::operator=(&upper_left,&fill_style);
      Am_Style::~Am_Style(&fill_style);
      Am_Image_Array::~Am_Image_Array(&local_60);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&upper_left,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
                 (ulong)(uint)(r_local.width + r_local.left),
                 (ulong)(uint)(r_local.height + r_local.top),uVar3);
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&upper_left,(ulong)(uint)r_local.left,
                 (ulong)((r_local.top + r_local.height) - 1),
                 (ulong)(uint)(r_local.left + -1 + r_local.width),(ulong)(uint)r_local.top,uVar3);
    }
  }
  else {
    if (look.value != Am_WINDOWS_LOOK_val) {
      if (look.value != Am_MOTIF_LOOK_val) {
        Am_Error("Unknown Look parameter");
      }
      if (mask) {
        (*draw->_vptr_Am_Drawonable[0x2c])
                  (draw,&Am_No_Style,&Am_On_Bits,uVar2 & 0xffffffff,uVar2 >> 0x20,uVar1 & 0xffffffff
                   ,uVar1 >> 0x20,0);
      }
      else {
        Am_Draw_Motif_Box(left,top,width,height,(bool)(SUB41(local_88,0) | local_78._0_1_),color_rec
                          ,draw);
      }
      goto LAB_00230b41;
    }
    Am_Style::Am_Style(&upper_left);
    Am_Style::Am_Style(&lower_right);
    Am_Style::operator=(&upper_left,&color_rec->data->background_style);
    Am_Style::operator=(&lower_right,&color_rec->data->highlight_style);
    if (mask) {
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_On_Bits,&Am_No_Style,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
                 (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,0);
    }
    else {
      r_00.top = r_local.top;
      r_00.left = r_local.left;
      r_00.width = r_local.width;
      r_00.height = r_local.height;
      Am_Style::Am_Style(&local_90,&upper_left);
      Am_Style::Am_Style(&local_98,&lower_right);
      Am_Draw_Rect_Border(r_00,&local_90,&local_98,draw);
      Am_Style::~Am_Style(&local_98);
      Am_Style::~Am_Style(&local_90);
    }
    Inset_Rect(&r_local,1);
    Am_Style::operator=(&upper_left,&color_rec->data->shadow_style);
    Am_Style::operator=(&lower_right,&color_rec->data->foreground_style);
    if (mask) {
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_On_Bits,&Am_No_Style,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
                 (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,0);
    }
    else {
      r_01.top = r_local.top;
      r_01.left = r_local.left;
      r_01.width = r_local.width;
      r_01.height = r_local.height;
      Am_Style::Am_Style(&local_a0,&upper_left);
      Am_Style::Am_Style(&local_a8,&lower_right);
      Am_Draw_Rect_Border(r_01,&local_a0,&local_a8,draw);
      Am_Style::~Am_Style(&local_a8);
      Am_Style::~Am_Style(&local_a0);
    }
    Inset_Rect(&r_local,1);
    if (local_78._0_1_ == '\0') {
      prev = &Am_White;
    }
    else {
      prev = &color_rec->data->foreground_style;
    }
    Am_Style::Am_Style(&fill_style,prev);
    uVar3 = 7;
    if (!mask) {
      uVar3 = 0;
    }
    (*draw->_vptr_Am_Drawonable[0x2c])
              (draw,&Am_No_Style,&fill_style,(ulong)(uint)r_local.left,(ulong)(uint)r_local.top,
               (ulong)(uint)r_local.width,(ulong)(uint)r_local.height,uVar3);
    if (local_88._0_1_ != '\0') {
      Am_Image_Array::Am_Image_Array(&local_50,&Am_No_Image);
      Am_Style::Am_Style(&line_style,"black",1,Am_CAP_BUTT,Am_JOIN_MITER,Am_LINE_SOLID,"\x04\x04",2,
                         Am_FILL_SOLID,Am_FILL_POLY_EVEN_ODD,(Am_Image_Array_Data *)&local_50);
      Am_Image_Array::~Am_Image_Array(&local_50);
      fVar4 = (float)r_local.width * 0.11111111;
      fVar5 = (float)r_local.top;
      fVar8 = fVar4 * 4.0 + fVar5 + -1.0;
      local_88 = fVar4 * 6.0 + fVar5 + -1.0;
      fStack_84 = local_88;
      fStack_80 = local_88;
      fStack_7c = local_88;
      if (fVar8 <= local_88) {
        local_48 = fVar4 + fVar4;
        fVar6 = (float)r_local.left;
        fVar7 = fVar6 + local_48;
        fStack_74 = local_88;
        fStack_70 = fVar4 * 0.0 + fVar5 + 0.0;
        fStack_6c = fVar4 * 0.0 + fVar5 + 0.0;
        do {
          local_78 = fVar8;
          (*draw->_vptr_Am_Drawonable[0x2a])
                    (draw,&line_style,&Am_No_Style,(ulong)(uint)(int)(fVar7 + -1.0 + 0.5),
                     (ulong)(uint)(int)(fVar8 + 0.5),
                     (ulong)(uint)(int)(fVar4 * 4.0 + fVar6 + -1.0 + 0.5),
                     (ulong)(uint)(int)(local_48 + fVar8 + 0.5),
                     (ulong)(uint)(int)(fVar4 * 8.0 + fVar6 + -1.0 + 0.5),
                     (ulong)(uint)(int)((fVar8 - local_48) + 0.5),uVar3);
          fVar8 = local_78 + 1.0;
        } while (fVar8 <= local_88);
      }
      Am_Style::~Am_Style(&line_style);
    }
    Am_Style::~Am_Style(&fill_style);
  }
  Am_Style::~Am_Style(&lower_right);
  Am_Style::~Am_Style(&upper_left);
LAB_00230b41:
  (*draw->_vptr_Am_Drawonable[0x22])(draw);
  return;
}

Assistant:

void
Am_Draw_Check_Button_Box(am_rect r, // coords in terms of draw
                         Am_Drawonable *draw, Am_Widget_Look look,
                         bool selected, bool interim_selected,
                         const Computed_Colors_Record &color_rec,
                         bool mask = false)
{
  bool depressed = selected || interim_selected;
  draw->Push_Clip(r.left, r.top, r.width, r.height);

  switch (look.value) {
  case Am_MOTIF_LOOK_val: // just use the every useful Am_Draw_Motif_Bo_valx
    if (mask)
      draw->Draw_Rectangle(Am_No_Style, Am_On_Bits, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Motif_Box(r.left, r.top, r.width, r.height, depressed, color_rec,
                        draw);
    break;
  case Am_WINDOWS_LOOK_val: {
    // draw the outside rectangle
    Am_Style upper_left, lower_right;
    upper_left = color_rec.data->background_style;
    lower_right = color_rec.data->highlight_style;
    if (mask)
      draw->Draw_Rectangle(Am_On_Bits, Am_No_Style, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Rect_Border(r, upper_left, lower_right, draw);
    Inset_Rect(r, 1);

    // draw the inside rectangle
    upper_left = color_rec.data->shadow_style;
    lower_right = color_rec.data->foreground_style;
    if (mask)
      draw->Draw_Rectangle(Am_On_Bits, Am_No_Style, r.left, r.top, r.width,
                           r.height);
    else
      Am_Draw_Rect_Border(r, upper_left, lower_right, draw);
    Inset_Rect(r, 1);

    // draw the fill
    Am_Style fill_style =
        interim_selected ? color_rec.data->foreground_style : Am_White;
    draw->Draw_Rectangle(Am_No_Style, fill_style, r.left, r.top, r.width,
                         r.height, mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);

    const float ninth = (float)1 / 9;
    if (selected) {
      Am_Style line_style("black", 1); // black and 1 pixel
      float pix = ninth * r.width, left_x = 2 * pix + r.left - 1 + 0.5f,
            center_x = 4 * pix + r.left - 1 + 0.5f,
            right_x = 8 * pix + r.left - 1 + 0.5f, min_y = 4 * pix + r.top - 1,
            max_y = 6 * pix + r.top - 1, twopix = 2 * pix;
      for (float y = min_y; y <= max_y; y += 1)
        draw->Draw_2_Lines(line_style, Am_No_Style, (int)left_x, (int)(y + 0.5),
                           (int)center_x, (int)(y + twopix + 0.5), (int)right_x,
                           (int)(y - twopix + 0.5),
                           mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    }
    break;
  }

  case Am_MACINTOSH_LOOK_val: {
    Am_Style line_style("black", interim_selected ? 2 : 1);
    Am_Style fill_style = Am_White;
    draw->Draw_Rectangle(line_style, fill_style, r.left, r.top, r.width,
                         r.height, mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    if (selected) { // draw the x mark
      line_style = Am_Style("black", 1);
      draw->Draw_Line(line_style, r.left, r.top, r.left + r.width,
                      r.top + r.height,
                      mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
      draw->Draw_Line(line_style, r.left, r.top + r.height - 1,
                      r.left + r.width - 1, r.top,
                      mask ? Am_DRAW_MASK_COPY : Am_DRAW_COPY);
    }
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  } // switch( look )

  draw->Pop_Clip();
}